

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O3

void __thiscall rw::Raster::subRaster(Raster *this,Raster *parent,Rect *r)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int32 iVar5;
  
  if ((this->flags & 0x80) != 0) {
    iVar5 = r->h;
    this->width = r->w;
    this->height = iVar5;
    uVar1 = parent->offsetX;
    uVar3 = parent->offsetY;
    uVar2 = r->x;
    uVar4 = r->y;
    this->offsetX = uVar2 + uVar1;
    this->offsetY = uVar4 + uVar3;
    this->parent = parent->parent;
  }
  return;
}

Assistant:

void
Raster::subRaster(Raster *parent, Rect *r)
{
	if((this->flags & DONTALLOCATE) == 0)
		return;
	this->width = r->w;
	this->height = r->h;
	this->offsetX = parent->offsetX + r->x;
	this->offsetY = parent->offsetY + r->y;
	this->parent = parent->parent;
}